

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_SubDVertex::Point
          (ON_3dPoint *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation point_location)

{
  ON_SubDComponentLocation point_location_local;
  ON_SubDVertex *this_local;
  
  if (point_location == Unset) {
    __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
    __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  }
  else if (point_location == ControlNet) {
    ControlNetPoint(__return_storage_ptr__,this);
  }
  else if (point_location == Surface) {
    SurfacePoint(__return_storage_ptr__,this);
  }
  else {
    __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
    __return_storage_ptr__->y = ON_3dPoint::NanPoint.y;
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDVertex::Point(ON_SubDComponentLocation point_location) const
{
  switch (point_location)
  {
  case ON_SubDComponentLocation::ControlNet:
    return this->ControlNetPoint();
    break;
  case ON_SubDComponentLocation::Surface:
    return this->SurfacePoint();
    break;
  case ON_SubDComponentLocation::Unset:
    return ON_3dPoint::NanPoint;
    break;
  }
  return ON_3dPoint::NanPoint;
}